

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.cpp
# Opt level: O0

void __thiscall
pbrt::BVHLightSampler::BVHLightSampler
          (BVHLightSampler *this,span<const_pbrt::Light> lights,Allocator alloc)

{
  polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_> alloc_00;
  ulong uVar1;
  bool bVar2;
  Bounds3<float> *b2;
  size_t sVar3;
  LightBounds *pLVar4;
  size_t sVar5;
  vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  *this_00;
  long in_RDI;
  long *in_FS_OFFSET;
  optional<pbrt::LightBounds> lightBounds;
  Light light;
  size_t i;
  vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  bvhLights;
  uint32_t in_stack_000004bc;
  int in_stack_000004c0;
  int in_stack_000004c4;
  vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  *in_stack_000004c8;
  BVHLightSampler *in_stack_000004d0;
  undefined4 in_stack_fffffffffffffd98;
  undefined4 in_stack_fffffffffffffd9c;
  int in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  polymorphic_allocator<pbrt::Light> *in_stack_fffffffffffffda8;
  long lVar6;
  vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *in_stack_fffffffffffffdb0;
  Light *in_stack_fffffffffffffdb8;
  vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *in_stack_fffffffffffffdc0;
  Bounds3<float> *b1;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  optional local_b0 [64];
  ulong local_70;
  vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
  local_68;
  polymorphic_allocator<pbrt::LightBVHNode> local_48 [3];
  polymorphic_allocator<pbrt::Light> local_30;
  Bounds3<float> local_28;
  span<const_pbrt::Light> local_10;
  
  pstd::span<const_pbrt::Light>::begin(&local_10);
  b2 = (Bounds3<float> *)pstd::span<const_pbrt::Light>::end(&local_10);
  b1 = &local_28;
  pstd::pmr::polymorphic_allocator<pbrt::Light>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pbrt::Light> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  pstd::vector<pbrt::Light,pstd::pmr::polymorphic_allocator<pbrt::Light>>::
  vector<pbrt::Light_const*>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(Light *)in_stack_fffffffffffffdb0,
             in_stack_fffffffffffffda8);
  pstd::pmr::polymorphic_allocator<pbrt::Light>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pbrt::Light> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::vector
            ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)(in_RDI + 0x20),
             &local_30);
  Bounds3<float>::Bounds3((Bounds3<float> *)in_stack_fffffffffffffdc0);
  pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>::polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pbrt::LightBVHNode> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  pstd::vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_>::vector
            ((vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_> *)
             (in_RDI + 0x58),local_48);
  pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>::
  polymorphic_allocator<std::byte>
            ((polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_> *)
             CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
             (polymorphic_allocator<std::byte> *)
             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
  alloc_00.memoryResource._4_4_ = in_stack_fffffffffffffda4;
  alloc_00.memoryResource._0_4_ = in_stack_fffffffffffffda0;
  HashMap<pbrt::Light,_unsigned_int,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>_>
  ::HashMap((HashMap<pbrt::Light,_unsigned_int,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98),alloc_00);
  std::
  vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>::
  vector((vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
          *)0x8f780b);
  for (local_70 = 0; uVar1 = local_70, sVar3 = pstd::span<const_pbrt::Light>::size(&local_10),
      uVar1 < sVar3; local_70 = local_70 + 1) {
    pstd::span<const_pbrt::Light>::operator[](&local_10,local_70);
    Light::Light((Light *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                 (Light *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
    Light::Bounds((Light *)in_stack_fffffffffffffda8);
    bVar2 = pstd::optional::operator_cast_to_bool(local_b0);
    if (bVar2) {
      pLVar4 = pstd::optional<pbrt::LightBounds>::operator->
                         ((optional<pbrt::LightBounds> *)0x8f7976);
      if (0.0 < pLVar4->phi) {
        pstd::optional<pbrt::LightBounds>::operator*((optional<pbrt::LightBounds> *)0x8f79a2);
        std::make_pair<unsigned_long&,pbrt::LightBounds&>
                  ((unsigned_long *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (LightBounds *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        std::pair<int,_pbrt::LightBounds>::pair<unsigned_long,_pbrt::LightBounds,_true>
                  ((pair<int,_pbrt::LightBounds> *)
                   CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                   (pair<unsigned_long,_pbrt::LightBounds> *)
                   CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        std::
        vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
        ::push_back((vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                     *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0),
                    (value_type *)CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
        pstd::optional<pbrt::LightBounds>::operator->((optional<pbrt::LightBounds> *)0x8f7a11);
        Union<float>(b1,b2);
        *(undefined8 *)(in_RDI + 0x40) = local_140;
        *(undefined8 *)(in_RDI + 0x48) = local_138;
        *(undefined8 *)(in_RDI + 0x50) = local_130;
      }
    }
    else {
      pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::push_back
                (in_stack_fffffffffffffdb0,(Light *)in_stack_fffffffffffffda8);
    }
    pstd::optional<pbrt::LightBounds>::~optional((optional<pbrt::LightBounds> *)0x8f7a6c);
  }
  bVar2 = std::
          vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
          ::empty((vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
                   *)in_stack_fffffffffffffdb0);
  if (!bVar2) {
    std::
    vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>::
    size(&local_68);
    buildBVH(in_stack_000004d0,in_stack_000004c8,in_stack_000004c4,in_stack_000004c0,
             in_stack_000004bc,in_stack_fffffffffffffda0);
  }
  sVar3 = pstd::vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_>::
          size((vector<pbrt::LightBVHNode,_pstd::pmr::polymorphic_allocator<pbrt::LightBVHNode>_> *)
               (in_RDI + 0x58));
  sVar5 = HashMap<pbrt::Light,_unsigned_int,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>_>
          ::capacity((HashMap<pbrt::Light,_unsigned_int,_std::hash<pbrt::Light>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<pbrt::Light,_unsigned_int>_>_>_>
                      *)0x8f7b0f);
  lVar6 = sVar3 * 0x20 + sVar5 * 4;
  sVar3 = pstd::span<const_pbrt::Light>::size(&local_10);
  lVar6 = lVar6 + sVar3 * 8;
  this_00 = (vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>
             *)pstd::vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_>::size
                         ((vector<pbrt::Light,_pstd::pmr::polymorphic_allocator<pbrt::Light>_> *)
                          (in_RDI + 0x20));
  *(long *)(*in_FS_OFFSET + -0x120) = lVar6 + (long)this_00 * 8 + *(long *)(*in_FS_OFFSET + -0x120);
  std::
  vector<std::pair<int,_pbrt::LightBounds>,_std::allocator<std::pair<int,_pbrt::LightBounds>_>_>::
  ~vector(this_00);
  return;
}

Assistant:

BVHLightSampler::BVHLightSampler(pstd::span<const Light> lights, Allocator alloc)
    : lights(lights.begin(), lights.end(), alloc),
      infiniteLights(alloc),
      nodes(alloc),
      lightToBitTrail(alloc) {
    // Initialize _infiniteLights_ array and light BVH
    std::vector<std::pair<int, LightBounds>> bvhLights;
    for (size_t i = 0; i < lights.size(); ++i) {
        // Store $i$th light in either _infiniteLights_ or _bvhLights_
        Light light = lights[i];
        pstd::optional<LightBounds> lightBounds = light.Bounds();
        if (!lightBounds)
            infiniteLights.push_back(light);
        else if (lightBounds->phi > 0) {
            bvhLights.push_back(std::make_pair(i, *lightBounds));
            allLightBounds = Union(allLightBounds, lightBounds->bounds);
        }
    }
    if (!bvhLights.empty())
        buildBVH(bvhLights, 0, bvhLights.size(), 0, 0);
    lightBVHBytes += nodes.size() * sizeof(LightBVHNode) +
                     lightToBitTrail.capacity() * sizeof(uint32_t) +
                     lights.size() * sizeof(Light) +
                     infiniteLights.size() * sizeof(Light);
}